

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Tprint<double>(VM *this)

{
  double dVar1;
  int iVar2;
  long lVar3;
  
  ensureStackUsed(this,2);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -2;
  lVar3 = std::cout;
  dVar1 = *(double *)
           ((this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar2 + -2);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar3 + -0x18)) = 6;
  std::ostream::_M_insert<double>(dVar1);
  return;
}

Assistant:

void VM::Tprint() {
    auto value = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        std::cout << std::fixed << std::setprecision(6) << value;
    }
    else if constexpr (std::is_integral_v<T>) {
        std::cout << value;
    }
}